

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobutton.cpp
# Opt level: O2

void radio_button_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  uint *puVar1;
  bool bVar2;
  bool interim_selected;
  bool active;
  bool key_selected;
  bool bVar3;
  bool box_on_left;
  int iVar4;
  int iVar5;
  int width;
  int height;
  int box_width;
  int box_height;
  Am_Value *pAVar6;
  char *string_00;
  ostream *poVar7;
  Am_Object obj;
  Am_String string;
  Am_Value value;
  Am_Font local_80;
  Am_Object local_78;
  Computed_Colors_Record color_rec;
  Am_Font font;
  Am_Widget_Look look;
  Am_Alignment align;
  
  pAVar6 = Am_Object::Get(self,100,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x65,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x188,0);
  box_width = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x187,0);
  box_height = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x172,0);
  bVar2 = Am_Value::Valid(pAVar6);
  pAVar6 = Am_Object::Get(self,0x173,0);
  interim_selected = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = Am_Object::Get(self,0xcc,0);
  active = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = Am_Object::Get(self,0x17c,0);
  key_selected = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = Am_Object::Get(self,0x17b,0);
  bVar3 = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = Am_Object::Get(self,0x186,0);
  box_on_left = Am_Value::operator_cast_to_bool(pAVar6);
  pAVar6 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font(&font,pAVar6);
  pAVar6 = Am_Object::Get(self,0x97,0);
  Am_Alignment::Am_Alignment(&align,pAVar6);
  pAVar6 = Am_Object::Get(self,0x1ad,0);
  color_rec.data = (Computed_Colors_Record_Data *)(pAVar6->value).wrapper_value;
  if (color_rec.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((color_rec.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar6 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,pAVar6);
  string.data = (Am_String_Data *)0x0;
  obj.data = (Am_Object_Data *)0x0;
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar6 = Am_Object::Get(self,0x1ae,1);
  Am_Value::operator=(&value,pAVar6);
  if (value.type == 0xa001) {
    Am_Object::operator=(&obj,&value);
  }
  else {
    if (value.type != 0x8008) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar7 = std::operator<<(poVar7,"Label of widget ");
      poVar7 = operator<<(poVar7,self);
      poVar7 = std::operator<<(poVar7," should have string or object value but it is ");
      poVar7 = operator<<(poVar7,&value);
      std::endl<char,std::char_traits<char>>(poVar7);
      Am_Error();
    }
    Am_String::operator=(&string,&value);
  }
  string_00 = Am_String::operator_cast_to_char_(&string);
  Am_Object::Am_Object(&local_78,&obj);
  Am_Font::Am_Font(&local_80,&font);
  Am_Draw_Button_Widget
            (iVar4 + x_offset,iVar5 + y_offset,width,height,string_00,&local_78,interim_selected,
             bVar2 && bVar3,active,key_selected,false,false,(Am_Font_Data *)&local_80,&color_rec,
             look,Am_RADIO_BUTTON,drawonable,box_width,box_height,box_on_left,align,5,false);
  Am_Font::~Am_Font(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Value::~Am_Value(&value);
  Am_Object::~Am_Object(&obj);
  Am_String::~Am_String(&string);
  Computed_Colors_Record::~Computed_Colors_Record(&color_rec);
  Am_Font::~Am_Font(&font);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, radio_button_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  int box_width = self.Get(Am_BOX_WIDTH);
  int box_height = self.Get(Am_BOX_HEIGHT);
  bool selected = self.Get(Am_SELECTED).Valid();
  bool interim_selected = self.Get(Am_INTERIM_SELECTED);
  bool active = self.Get(Am_ACTIVE);
  bool key_selected = self.Get(Am_KEY_SELECTED);
  bool want_final_selected = self.Get(Am_FINAL_FEEDBACK_WANTED);
  bool box_on_left = self.Get(Am_BOX_ON_LEFT);
  Am_Font font(self.Get(Am_FONT));
  Am_Alignment align = self.Get(Am_H_ALIGN);

  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  // now find the contents to draw in the button
  Am_String string;
  Am_Object obj;
  Am_Value value;

  // string slot contains a formula which gets the real object based on the
  // value of the COMMAND slot
  value = self.Peek(Am_REAL_STRING_OR_OBJ);
  if (value.type == Am_STRING)
    string = value;
  else if (value.type == Am_OBJECT)
    obj = value;
  else
    Am_ERRORO("Label of widget "
                  << self << " should have string or object value but it is "
                  << value,
              self, Am_REAL_STRING_OR_OBJ);
  // finally ready to draw it
  Am_Draw_Button_Widget(left, top, width, height, string, obj, interim_selected,
                        selected && want_final_selected, active, key_selected,
                        false, false, font, color_rec, look, Am_RADIO_BUTTON,
                        drawonable, box_width, box_height, box_on_left, align,
                        5);
}